

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseVisibilityTest_Edition2024NoServiceVisibility_Test
::TestBody(ParseVisibilityTest_Edition2024NoServiceVisibility_Test *this)

{
  string_view text;
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  MStack_28;
  
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher((Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&MStack_28,
            "2:14: \'local\' and \'export\' visibility modifiers are valid only on \'message\' and \'enum\'\n"
           );
  text._M_str = "\n        edition = \"2024\";\n        local service Foo {\n        }\n        ";
  text._M_len = 0x49;
  ParserTest::ExpectHasErrors
            (&this->super_ParseVisibilityTest,text,
             (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&MStack_28);
  testing::internal::
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~MatcherBase(&MStack_28);
  return;
}

Assistant:

TEST_F(ParseVisibilityTest, Edition2024NoServiceVisibility) {
  ExpectHasErrors(
      R"schema(
        edition = "2024";
        local service Foo {
        }
        )schema",
      "2:14: 'local' and 'export' visibility modifiers are valid only on "
      "'message' and 'enum'\n");
}